

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:573:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:573:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  bool bVar1;
  uint32_t l;
  uint32_t uVar2;
  uint uVar3;
  value *v;
  gc_heap_ptr_untyped *this_00;
  ulong uVar4;
  undefined8 *puVar5;
  object *poVar6;
  long *plVar7;
  long *plVar8;
  uint32_t index;
  uint32_t index_00;
  uint index_01;
  uint32_t index_02;
  uint32_t index_03;
  uint32_t index_04;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar9;
  undefined8 extraout_RDX_03;
  uint32_t k_1;
  uint32_t uVar10;
  anon_class_16_1_570cf4e1_for_f *this_01;
  uint32_t k;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  wstring prop_name;
  value local_110;
  ulong local_e8;
  wstring to_name;
  size_type local_a8;
  pointer local_a0;
  wstring_view local_98;
  gc_heap_ptr_untyped *local_88;
  ulong local_80;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_78;
  object_ptr res;
  gc_heap_ptr_untyped local_58;
  ulong local_48;
  
  this_01 = &this->f;
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  uVar4 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x28;
  local_88 = (gc_heap_ptr_untyped *)this_01;
  local_78 = args;
  make_array((gc_heap_ptr<mjs::global_object> *)&res,(uint32_t)this_01);
  if ((int)uVar4 == 0) {
    value::value(__return_storage_ptr__,&res);
  }
  else {
    puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
    prop_name._M_dataplus._M_p = (pointer)0x6;
    prop_name._M_string_length = 0x180a64;
    (**(code **)*puVar5)(&local_110,puVar5);
    l = to_uint32(&local_110);
    value::~value(&local_110);
    uVar2 = anon_unknown_110::calc_start_index
                      ((local_78->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                       _M_impl.super__Vector_impl_data._M_start,l);
    uVar13 = (ulong)uVar2;
    local_80 = uVar4;
    if ((int)uVar4 == 1) {
      uVar9 = extraout_RDX;
      dVar15 = (double)l;
    }
    else {
      dVar14 = to_integer((local_78->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_start + 1);
      uVar9 = extraout_RDX_00;
      dVar15 = 0.0;
      if (0.0 <= dVar14) {
        dVar15 = dVar14;
      }
    }
    dVar14 = (double)l - (double)uVar13;
    if (dVar15 <= (double)l - (double)uVar13) {
      dVar14 = dVar15;
    }
    local_e8 = (ulong)dVar14;
    h = (((gc_heap_ptr<mjs::global_object> *)&local_88->heap_)->super_gc_heap_ptr_untyped).heap_;
    local_48 = uVar13;
    for (uVar11 = 0; (uint)local_e8 != uVar11; uVar11 = uVar11 + 1) {
      index_string_abi_cxx11_(&prop_name,(mjs *)(ulong)(uVar2 + uVar11),(uint32_t)uVar9);
      poVar6 = (object *)gc_heap_ptr_untyped::get(this_00);
      local_110._0_8_ = prop_name._M_string_length;
      local_110.field_1.n_ = (double)prop_name._M_dataplus._M_p;
      bVar1 = object::has_property(poVar6,(wstring_view *)&local_110);
      if (bVar1) {
        plVar7 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
        index_string_abi_cxx11_(&to_name,(mjs *)(ulong)uVar11,index);
        local_98._M_len = to_name._M_string_length;
        local_98._M_str = to_name._M_dataplus._M_p;
        string::string((string *)&local_58,h,&local_98);
        puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
        local_a8 = prop_name._M_string_length;
        local_a0 = prop_name._M_dataplus._M_p;
        (**(code **)*puVar5)(&local_110,puVar5,&local_a8);
        (**(code **)(*plVar7 + 8))(plVar7,&local_58,&local_110,0);
        value::~value(&local_110);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
        std::__cxx11::wstring::~wstring((wstring *)&to_name);
      }
      std::__cxx11::wstring::~wstring((wstring *)&prop_name);
      uVar9 = extraout_RDX_01;
    }
    plVar7 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
    plVar8 = (long *)gc_heap_ptr_untyped::get(local_88);
    uVar4 = local_80;
    (**(code **)(*plVar8 + 0x98))(&prop_name,plVar8,"length");
    uVar12 = (uint)local_e8;
    local_110.field_1.n_ = (double)(local_e8 & 0xffffffff);
    local_110.type_ = 3;
    (**(code **)(*plVar7 + 8))(plVar7,&prop_name,&local_110,0);
    value::~value(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&prop_name);
    uVar11 = (uint)uVar4;
    uVar4 = (ulong)(uVar11 - 2);
    if (uVar11 < 2) {
      uVar4 = 0;
    }
    uVar3 = (uint)uVar4;
    if (uVar3 < uVar12) {
      uVar9 = extraout_RDX_02;
      while (uVar11 = (uint)uVar13, uVar11 < l - uVar12) {
        index_string_abi_cxx11_(&prop_name,(mjs *)(ulong)((int)local_e8 + uVar11),(uint32_t)uVar9);
        index_string_abi_cxx11_(&to_name,(mjs *)(ulong)(uVar3 + uVar11),index_00);
        poVar6 = (object *)gc_heap_ptr_untyped::get(this_00);
        local_110._0_8_ = prop_name._M_string_length;
        local_110.field_1.n_ = (double)prop_name._M_dataplus._M_p;
        bVar1 = object::has_property(poVar6,(wstring_view *)&local_110);
        if (bVar1) {
          plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
          local_98._M_len = to_name._M_string_length;
          local_98._M_str = to_name._M_dataplus._M_p;
          string::string((string *)&local_58,h,&local_98);
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
          local_a8 = prop_name._M_string_length;
          local_a0 = prop_name._M_dataplus._M_p;
          (**(code **)*puVar5)(&local_110,puVar5,&local_a8);
          (**(code **)(*plVar7 + 8))(plVar7,&local_58,&local_110,0);
          value::~value(&local_110);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
        }
        else {
          plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
          local_110._0_8_ = to_name._M_string_length;
          local_110.field_1.n_ = (double)to_name._M_dataplus._M_p;
          (**(code **)(*plVar7 + 0x10))(plVar7,&local_110);
        }
        std::__cxx11::wstring::~wstring((wstring *)&to_name);
        std::__cxx11::wstring::~wstring((wstring *)&prop_name);
        uVar9 = extraout_RDX_03;
        uVar13 = (ulong)(uVar11 + 1);
      }
      uVar11 = l;
      while ((l - uVar12) + uVar3 < uVar11) {
        plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
        uVar11 = uVar11 - 1;
        index_string_abi_cxx11_((wstring *)&local_110,(mjs *)(ulong)uVar11,index_03);
        prop_name._M_dataplus._M_p = (pointer)local_110.field_1.n_;
        prop_name._M_string_length = local_110._0_8_;
        (**(code **)(*plVar7 + 0x10))(plVar7,&prop_name);
        std::__cxx11::wstring::~wstring((wstring *)&local_110);
      }
    }
    else if (uVar12 < uVar3) {
      index_01 = l - (uint)local_e8;
      uVar12 = 2;
      if (uVar11 < 2) {
        uVar12 = uVar11;
      }
      local_80 = (ulong)(~uVar12 + uVar11);
      uVar10 = l;
      for (; uVar10 = uVar10 - 1, uVar2 < index_01; index_01 = index_01 - 1) {
        index_string_abi_cxx11_(&prop_name,(mjs *)(ulong)uVar10,index_01);
        index_string_abi_cxx11_(&to_name,(mjs *)(ulong)((int)local_80 + index_01),index_02);
        poVar6 = (object *)gc_heap_ptr_untyped::get(this_00);
        local_110._0_8_ = prop_name._M_string_length;
        local_110.field_1.n_ = (double)prop_name._M_dataplus._M_p;
        bVar1 = object::has_property(poVar6,(wstring_view *)&local_110);
        if (bVar1) {
          plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
          local_98._M_len = to_name._M_string_length;
          local_98._M_str = to_name._M_dataplus._M_p;
          string::string((string *)&local_58,h,&local_98);
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
          local_a8 = prop_name._M_string_length;
          local_a0 = prop_name._M_dataplus._M_p;
          (**(code **)*puVar5)(&local_110,puVar5,&local_a8);
          (**(code **)(*plVar7 + 8))(plVar7,&local_58,&local_110,0);
          value::~value(&local_110);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
        }
        else {
          plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
          local_110._0_8_ = to_name._M_string_length;
          local_110.field_1.n_ = (double)to_name._M_dataplus._M_p;
          (**(code **)(*plVar7 + 0x10))(plVar7,&local_110);
        }
        std::__cxx11::wstring::~wstring((wstring *)&to_name);
        std::__cxx11::wstring::~wstring((wstring *)&prop_name);
      }
    }
    for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
      plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
      index_string_abi_cxx11_
                ((wstring *)&local_110,(mjs *)(ulong)(uint)((int)local_48 + (int)uVar13),index_04);
      to_name._M_dataplus._M_p = (pointer)local_110.field_1.n_;
      to_name._M_string_length = local_110._0_8_;
      string::string((string *)&prop_name,h,(wstring_view *)&to_name);
      (**(code **)(*plVar7 + 8))
                (plVar7,&prop_name,
                 (local_78->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start + ((int)uVar13 + 2),0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&prop_name);
      std::__cxx11::wstring::~wstring((wstring *)&local_110);
    }
    plVar7 = (long *)gc_heap_ptr_untyped::get(this_00);
    plVar8 = (long *)gc_heap_ptr_untyped::get(local_88);
    (**(code **)(*plVar8 + 0x98))(&prop_name,plVar8,"length");
    local_110.field_1.n_ = (double)((l + uVar3) - (uint)local_e8);
    local_110.type_ = 3;
    (**(code **)(*plVar7 + 8))(plVar7,&prop_name,&local_110,0);
    value::~value(&local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&prop_name);
    value::value(__return_storage_ptr__,&res);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&res.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }